

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_context.c
# Opt level: O3

int pcre2_set_glob_separator_16(pcre2_convert_context_16 *ccontext,uint32_t separator)

{
  int iVar1;
  
  iVar1 = -0x1d;
  if ((separator - 0x2e < 0x2f) &&
     ((0x400000000003U >> ((ulong)(separator - 0x2e) & 0x3f) & 1) != 0)) {
    ccontext->glob_separator = separator;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

PCRE2_CALL_CONVENTION
pcre2_set_glob_separator(pcre2_convert_context *ccontext, uint32_t separator)
{
if (separator != CHAR_SLASH && separator != CHAR_BACKSLASH &&
    separator != CHAR_DOT) return PCRE2_ERROR_BADDATA;
ccontext->glob_separator = separator;
return 0;
}